

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceSpec.cxx
# Opt level: O1

int testCTestResourceSpec(int argc,char **argv)

{
  ReadFileResult result;
  bool bVar1;
  ReadFileResult result_00;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  pointer pEVar5;
  int iVar6;
  cmCTestResourceSpec *other;
  string path;
  string local_90;
  pointer local_70;
  char **local_68;
  cmCTestResourceSpec local_60;
  
  local_68 = argv;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid arguments.\n",0x13);
    iVar6 = -1;
  }
  else {
    local_70 = expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      other = &(expectedResourceSpecs.
                super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>._M_impl.
                super__Vector_impl_data._M_start)->Expected;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,local_68[1],(allocator<char> *)&local_60);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::_M_append((char *)&local_90,*(ulong *)((long)(other + -1) + 8));
        result = *(ReadFileResult *)((long)(other + -1) + 0x28);
        local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header;
        local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        result_00 = cmCTestResourceSpec::ReadFromJSONFile(&local_60,&local_90);
        if (result_00 == result) {
          bVar1 = cmCTestResourceSpec::operator!=(&local_60,other);
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ReadFromJSONFile(\"",0x12);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_90._M_dataplus._M_p,
                                local_90._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2,"\") did not give expected spec",0x1d);
            std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
            goto LAB_00173208;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ReadFromJSONFile(\"",0x12);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_90._M_dataplus._M_p,
                              local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\") returned \"",0xd);
          pcVar3 = cmCTestResourceSpec::ResultToString(result_00);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)poVar2->_vptr_basic_ostream[-3] + (int)poVar2);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", should be \"",0xe);
          pcVar3 = cmCTestResourceSpec::ResultToString(result);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
LAB_00173208:
          std::ostream::put((char)poVar2);
          iVar6 = -1;
          std::ostream::flush();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                     *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        pEVar5 = (pointer)(other + 1);
        other = (cmCTestResourceSpec *)((long)(other + 1) + 0x28);
      } while (pEVar5 != local_70);
    }
  }
  return iVar6;
}

Assistant:

int testCTestResourceSpec(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  for (auto const& spec : expectedResourceSpecs) {
    std::string path = argv[1];
    path += "/testCTestResourceSpec_data/";
    path += spec.Path;
    if (!testSpec(path, spec.ParseResult, spec.Expected)) {
      retval = -1;
    }
  }

  return retval;
}